

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

void sendMTFValues(EState *s)

{
  UChar UVar1;
  UChar UVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  int iVar55;
  UInt16 *pUVar56;
  int alphaSize_00;
  Int32 *s_code_sel_selCtr;
  UChar *s_len_sel_selCtr;
  char acStack_c8 [2];
  UInt16 mtfv_i;
  Int32 curr;
  Bool_conflict inUse16 [16];
  UChar local_a9;
  UChar local_a6 [5];
  UChar tmp;
  UChar tmp2;
  UChar ll_i;
  UChar pos [6];
  UInt16 icv_1;
  UInt16 icv;
  UInt32 cost45;
  UInt32 cost23;
  UInt32 cost01;
  Int32 aFreq;
  Int32 tFreq;
  Int32 remF;
  Int32 nPart;
  UInt16 *mtfv;
  Int32 fave [6];
  UInt16 cost [6];
  Int32 nBytes;
  Int32 nGroups;
  Int32 selCtr;
  Int32 maxLen;
  Int32 minLen;
  Int32 alphaSize;
  Int32 nSelectors;
  Int32 iter;
  Int32 bc;
  Int32 bt;
  Int32 totc;
  Int32 ge;
  Int32 gs;
  Int32 j;
  Int32 i;
  Int32 t;
  Int32 v;
  EState *s_local;
  
  minLen = 0;
  pUVar56 = s->mtfv;
  if (2 < s->verbosity) {
    fprintf(_stderr,"      %d in block, %d after MTF & 1-2 coding, %d+2 syms in use\n",
            (ulong)(uint)s->nblock,(ulong)(uint)s->nMTF,(ulong)(uint)s->nInUse);
  }
  iVar55 = s->nInUse;
  alphaSize_00 = iVar55 + 2;
  for (j = 0; j < 6; j = j + 1) {
    for (i = 0; i < alphaSize_00; i = i + 1) {
      s->len[j][i] = '\x0f';
    }
  }
  if (s->nMTF < 1) {
    BZ2_bz__AssertH__fail(0xbb9);
  }
  if (s->nMTF < 200) {
    cost[4] = 2;
    cost[5] = 0;
  }
  else if (s->nMTF < 600) {
    cost[4] = 3;
    cost[5] = 0;
  }
  else if (s->nMTF < 0x4b0) {
    cost[4] = 4;
    cost[5] = 0;
  }
  else if (s->nMTF < 0x960) {
    cost[4] = 5;
    cost[5] = 0;
  }
  else {
    cost[4] = 6;
    cost[5] = 0;
  }
  tFreq._0_2_ = cost[4];
  tFreq._2_2_ = cost[5];
  aFreq = s->nMTF;
  totc = 0;
  while( true ) {
    if (tFreq < 1) break;
    bt = totc + -1;
    for (cost23 = 0; (int)cost23 < aFreq / tFreq && bt < iVar55 + 1;
        cost23 = s->mtfFreq[bt] + cost23) {
      bt = bt + 1;
    }
    if ((((totc < bt) && (tFreq != cost._8_4_)) && (tFreq != 1)) && ((cost._8_4_ - tFreq) % 2 == 1))
    {
      cost23 = cost23 - s->mtfFreq[bt];
      bt = bt + -1;
    }
    if (2 < s->verbosity) {
      fprintf(_stderr,"      initial group %d, [%d .. %d], has %d syms (%4.1f%%)\n",
              ((double)(int)cost23 * 100.0) / (double)s->nMTF,(ulong)(uint)tFreq,(ulong)(uint)totc,
              (ulong)(uint)bt,(ulong)cost23);
    }
    for (i = 0; i < alphaSize_00; i = i + 1) {
      if ((i < totc) || (bt < i)) {
        s->len[tFreq + -1][i] = '\x0f';
      }
      else {
        s->len[tFreq + -1][i] = '\0';
      }
    }
    tFreq = tFreq + -1;
    totc = bt + 1;
    aFreq = aFreq - cost23;
  }
  for (alphaSize = 0; alphaSize < 4; alphaSize = alphaSize + 1) {
    for (j = 0; j < (int)cost._8_4_; j = j + 1) {
      fave[(long)j + -2] = 0;
    }
    for (j = 0; j < (int)cost._8_4_; j = j + 1) {
      for (i = 0; i < alphaSize_00; i = i + 1) {
        s->rfreq[j][i] = 0;
      }
    }
    if (cost._8_4_ == 6) {
      for (i = 0; i < alphaSize_00; i = i + 1) {
        s->len_pack[i][0] = (uint)s->len[1][i] << 0x10 | (uint)s->len[0][i];
        s->len_pack[i][1] = (uint)s->len[3][i] << 0x10 | (uint)s->len[2][i];
        s->len_pack[i][2] = (uint)s->len[5][i] << 0x10 | (uint)s->len[4][i];
      }
    }
    minLen = 0;
    bc = 0;
    totc = 0;
    while (totc < s->nMTF) {
      bt = totc + 0x31;
      if (s->nMTF <= bt) {
        bt = s->nMTF + -1;
      }
      for (j = 0; j < (int)cost._8_4_; j = j + 1) {
        cost[(long)j + -4] = 0;
      }
      if ((cost._8_4_ == 6) && (bt - totc == 0x31)) {
        uVar5 = pUVar56[totc];
        uVar6 = pUVar56[totc + 1];
        uVar7 = pUVar56[totc + 2];
        uVar8 = pUVar56[totc + 3];
        uVar9 = pUVar56[totc + 4];
        uVar10 = pUVar56[totc + 5];
        uVar11 = pUVar56[totc + 6];
        uVar12 = pUVar56[totc + 7];
        uVar13 = pUVar56[totc + 8];
        uVar14 = pUVar56[totc + 9];
        uVar15 = pUVar56[totc + 10];
        uVar16 = pUVar56[totc + 0xb];
        uVar17 = pUVar56[totc + 0xc];
        uVar18 = pUVar56[totc + 0xd];
        uVar19 = pUVar56[totc + 0xe];
        uVar20 = pUVar56[totc + 0xf];
        uVar21 = pUVar56[totc + 0x10];
        uVar22 = pUVar56[totc + 0x11];
        uVar23 = pUVar56[totc + 0x12];
        uVar24 = pUVar56[totc + 0x13];
        uVar25 = pUVar56[totc + 0x14];
        uVar26 = pUVar56[totc + 0x15];
        uVar27 = pUVar56[totc + 0x16];
        uVar28 = pUVar56[totc + 0x17];
        uVar29 = pUVar56[totc + 0x18];
        uVar30 = pUVar56[totc + 0x19];
        uVar31 = pUVar56[totc + 0x1a];
        uVar32 = pUVar56[totc + 0x1b];
        uVar33 = pUVar56[totc + 0x1c];
        uVar34 = pUVar56[totc + 0x1d];
        uVar35 = pUVar56[totc + 0x1e];
        uVar36 = pUVar56[totc + 0x1f];
        uVar37 = pUVar56[totc + 0x20];
        uVar38 = pUVar56[totc + 0x21];
        uVar39 = pUVar56[totc + 0x22];
        uVar40 = pUVar56[totc + 0x23];
        uVar41 = pUVar56[totc + 0x24];
        uVar42 = pUVar56[totc + 0x25];
        uVar43 = pUVar56[totc + 0x26];
        uVar44 = pUVar56[totc + 0x27];
        uVar45 = pUVar56[totc + 0x28];
        uVar46 = pUVar56[totc + 0x29];
        uVar47 = pUVar56[totc + 0x2a];
        uVar48 = pUVar56[totc + 0x2b];
        uVar49 = pUVar56[totc + 0x2c];
        uVar50 = pUVar56[totc + 0x2d];
        uVar51 = pUVar56[totc + 0x2e];
        uVar52 = pUVar56[totc + 0x2f];
        uVar53 = pUVar56[totc + 0x30];
        uVar54 = pUVar56[totc + 0x31];
        pos[0] = (char)uVar54;
        pos[1] = (char)(uVar54 >> 8);
        fave[4] = s->len_pack[uVar54][0] +
                  s->len_pack[uVar53][0] +
                  s->len_pack[uVar52][0] +
                  s->len_pack[uVar51][0] +
                  s->len_pack[uVar50][0] +
                  s->len_pack[uVar49][0] +
                  s->len_pack[uVar48][0] +
                  s->len_pack[uVar47][0] +
                  s->len_pack[uVar46][0] +
                  s->len_pack[uVar45][0] +
                  s->len_pack[uVar44][0] +
                  s->len_pack[uVar43][0] +
                  s->len_pack[uVar42][0] +
                  s->len_pack[uVar41][0] +
                  s->len_pack[uVar40][0] +
                  s->len_pack[uVar39][0] +
                  s->len_pack[uVar38][0] +
                  s->len_pack[uVar37][0] +
                  s->len_pack[uVar36][0] +
                  s->len_pack[uVar35][0] +
                  s->len_pack[uVar34][0] +
                  s->len_pack[uVar33][0] +
                  s->len_pack[uVar32][0] +
                  s->len_pack[uVar31][0] +
                  s->len_pack[uVar30][0] +
                  s->len_pack[uVar29][0] +
                  s->len_pack[uVar28][0] +
                  s->len_pack[uVar27][0] +
                  s->len_pack[uVar26][0] +
                  s->len_pack[uVar25][0] +
                  s->len_pack[uVar24][0] +
                  s->len_pack[uVar23][0] +
                  s->len_pack[uVar22][0] +
                  s->len_pack[uVar21][0] +
                  s->len_pack[uVar20][0] +
                  s->len_pack[uVar19][0] +
                  s->len_pack[uVar18][0] +
                  s->len_pack[uVar17][0] +
                  s->len_pack[uVar16][0] +
                  s->len_pack[uVar15][0] +
                  s->len_pack[uVar14][0] +
                  s->len_pack[uVar13][0] +
                  s->len_pack[uVar12][0] +
                  s->len_pack[uVar11][0] +
                  s->len_pack[uVar10][0] +
                  s->len_pack[uVar9][0] +
                  s->len_pack[uVar8][0] +
                  s->len_pack[uVar7][0] + s->len_pack[uVar6][0] + s->len_pack[uVar5][0];
        fave[5] = s->len_pack[uVar54][1] +
                  s->len_pack[uVar53][1] +
                  s->len_pack[uVar52][1] +
                  s->len_pack[uVar51][1] +
                  s->len_pack[uVar50][1] +
                  s->len_pack[uVar49][1] +
                  s->len_pack[uVar48][1] +
                  s->len_pack[uVar47][1] +
                  s->len_pack[uVar46][1] +
                  s->len_pack[uVar45][1] +
                  s->len_pack[uVar44][1] +
                  s->len_pack[uVar43][1] +
                  s->len_pack[uVar42][1] +
                  s->len_pack[uVar41][1] +
                  s->len_pack[uVar40][1] +
                  s->len_pack[uVar39][1] +
                  s->len_pack[uVar38][1] +
                  s->len_pack[uVar37][1] +
                  s->len_pack[uVar36][1] +
                  s->len_pack[uVar35][1] +
                  s->len_pack[uVar34][1] +
                  s->len_pack[uVar33][1] +
                  s->len_pack[uVar32][1] +
                  s->len_pack[uVar31][1] +
                  s->len_pack[uVar30][1] +
                  s->len_pack[uVar29][1] +
                  s->len_pack[uVar28][1] +
                  s->len_pack[uVar27][1] +
                  s->len_pack[uVar26][1] +
                  s->len_pack[uVar25][1] +
                  s->len_pack[uVar24][1] +
                  s->len_pack[uVar23][1] +
                  s->len_pack[uVar22][1] +
                  s->len_pack[uVar21][1] +
                  s->len_pack[uVar20][1] +
                  s->len_pack[uVar19][1] +
                  s->len_pack[uVar18][1] +
                  s->len_pack[uVar17][1] +
                  s->len_pack[uVar16][1] +
                  s->len_pack[uVar15][1] +
                  s->len_pack[uVar14][1] +
                  s->len_pack[uVar13][1] +
                  s->len_pack[uVar12][1] +
                  s->len_pack[uVar11][1] +
                  s->len_pack[uVar10][1] +
                  s->len_pack[uVar9][1] +
                  s->len_pack[uVar8][1] +
                  s->len_pack[uVar7][1] + s->len_pack[uVar6][1] + s->len_pack[uVar5][1];
        pos._2_4_ = s->len_pack[uVar54][2] +
                    s->len_pack[uVar53][2] +
                    s->len_pack[uVar52][2] +
                    s->len_pack[uVar51][2] +
                    s->len_pack[uVar50][2] +
                    s->len_pack[uVar49][2] +
                    s->len_pack[uVar48][2] +
                    s->len_pack[uVar47][2] +
                    s->len_pack[uVar46][2] +
                    s->len_pack[uVar45][2] +
                    s->len_pack[uVar44][2] +
                    s->len_pack[uVar43][2] +
                    s->len_pack[uVar42][2] +
                    s->len_pack[uVar41][2] +
                    s->len_pack[uVar40][2] +
                    s->len_pack[uVar39][2] +
                    s->len_pack[uVar38][2] +
                    s->len_pack[uVar37][2] +
                    s->len_pack[uVar36][2] +
                    s->len_pack[uVar35][2] +
                    s->len_pack[uVar34][2] +
                    s->len_pack[uVar33][2] +
                    s->len_pack[uVar32][2] +
                    s->len_pack[uVar31][2] +
                    s->len_pack[uVar30][2] +
                    s->len_pack[uVar29][2] +
                    s->len_pack[uVar28][2] +
                    s->len_pack[uVar27][2] +
                    s->len_pack[uVar26][2] +
                    s->len_pack[uVar25][2] +
                    s->len_pack[uVar24][2] +
                    s->len_pack[uVar23][2] +
                    s->len_pack[uVar22][2] +
                    s->len_pack[uVar21][2] +
                    s->len_pack[uVar20][2] +
                    s->len_pack[uVar19][2] +
                    s->len_pack[uVar18][2] +
                    s->len_pack[uVar17][2] +
                    s->len_pack[uVar16][2] +
                    s->len_pack[uVar15][2] +
                    s->len_pack[uVar14][2] +
                    s->len_pack[uVar13][2] +
                    s->len_pack[uVar12][2] +
                    s->len_pack[uVar11][2] +
                    s->len_pack[uVar10][2] +
                    s->len_pack[uVar9][2] +
                    s->len_pack[uVar8][2] +
                    s->len_pack[uVar7][2] + s->len_pack[uVar6][2] + s->len_pack[uVar5][2];
      }
      else {
        for (gs = totc; gs <= bt; gs = gs + 1) {
          _tmp2 = pUVar56[gs];
          for (j = 0; j < (int)cost._8_4_; j = j + 1) {
            cost[(long)j + -4] = cost[(long)j + -4] + (ushort)s->len[j][_tmp2];
          }
        }
      }
      nSelectors = 999999999;
      iter = -1;
      for (j = 0; j < (int)cost._8_4_; j = j + 1) {
        if ((uint)cost[(long)j + -4] < (uint)nSelectors) {
          nSelectors = (Int32)cost[(long)j + -4];
          iter = j;
        }
      }
      bc = nSelectors + bc;
      fave[(long)iter + -2] = fave[(long)iter + -2] + 1;
      s->selector[minLen] = (UChar)iter;
      minLen = minLen + 1;
      if ((cost._8_4_ == 6) && (bt - totc == 0x31)) {
        s->rfreq[iter][pUVar56[totc]] = s->rfreq[iter][pUVar56[totc]] + 1;
        s->rfreq[iter][pUVar56[totc + 1]] = s->rfreq[iter][pUVar56[totc + 1]] + 1;
        s->rfreq[iter][pUVar56[totc + 2]] = s->rfreq[iter][pUVar56[totc + 2]] + 1;
        s->rfreq[iter][pUVar56[totc + 3]] = s->rfreq[iter][pUVar56[totc + 3]] + 1;
        s->rfreq[iter][pUVar56[totc + 4]] = s->rfreq[iter][pUVar56[totc + 4]] + 1;
        s->rfreq[iter][pUVar56[totc + 5]] = s->rfreq[iter][pUVar56[totc + 5]] + 1;
        s->rfreq[iter][pUVar56[totc + 6]] = s->rfreq[iter][pUVar56[totc + 6]] + 1;
        s->rfreq[iter][pUVar56[totc + 7]] = s->rfreq[iter][pUVar56[totc + 7]] + 1;
        s->rfreq[iter][pUVar56[totc + 8]] = s->rfreq[iter][pUVar56[totc + 8]] + 1;
        s->rfreq[iter][pUVar56[totc + 9]] = s->rfreq[iter][pUVar56[totc + 9]] + 1;
        s->rfreq[iter][pUVar56[totc + 10]] = s->rfreq[iter][pUVar56[totc + 10]] + 1;
        s->rfreq[iter][pUVar56[totc + 0xb]] = s->rfreq[iter][pUVar56[totc + 0xb]] + 1;
        s->rfreq[iter][pUVar56[totc + 0xc]] = s->rfreq[iter][pUVar56[totc + 0xc]] + 1;
        s->rfreq[iter][pUVar56[totc + 0xd]] = s->rfreq[iter][pUVar56[totc + 0xd]] + 1;
        s->rfreq[iter][pUVar56[totc + 0xe]] = s->rfreq[iter][pUVar56[totc + 0xe]] + 1;
        s->rfreq[iter][pUVar56[totc + 0xf]] = s->rfreq[iter][pUVar56[totc + 0xf]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x10]] = s->rfreq[iter][pUVar56[totc + 0x10]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x11]] = s->rfreq[iter][pUVar56[totc + 0x11]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x12]] = s->rfreq[iter][pUVar56[totc + 0x12]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x13]] = s->rfreq[iter][pUVar56[totc + 0x13]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x14]] = s->rfreq[iter][pUVar56[totc + 0x14]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x15]] = s->rfreq[iter][pUVar56[totc + 0x15]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x16]] = s->rfreq[iter][pUVar56[totc + 0x16]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x17]] = s->rfreq[iter][pUVar56[totc + 0x17]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x18]] = s->rfreq[iter][pUVar56[totc + 0x18]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x19]] = s->rfreq[iter][pUVar56[totc + 0x19]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x1a]] = s->rfreq[iter][pUVar56[totc + 0x1a]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x1b]] = s->rfreq[iter][pUVar56[totc + 0x1b]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x1c]] = s->rfreq[iter][pUVar56[totc + 0x1c]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x1d]] = s->rfreq[iter][pUVar56[totc + 0x1d]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x1e]] = s->rfreq[iter][pUVar56[totc + 0x1e]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x1f]] = s->rfreq[iter][pUVar56[totc + 0x1f]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x20]] = s->rfreq[iter][pUVar56[totc + 0x20]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x21]] = s->rfreq[iter][pUVar56[totc + 0x21]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x22]] = s->rfreq[iter][pUVar56[totc + 0x22]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x23]] = s->rfreq[iter][pUVar56[totc + 0x23]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x24]] = s->rfreq[iter][pUVar56[totc + 0x24]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x25]] = s->rfreq[iter][pUVar56[totc + 0x25]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x26]] = s->rfreq[iter][pUVar56[totc + 0x26]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x27]] = s->rfreq[iter][pUVar56[totc + 0x27]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x28]] = s->rfreq[iter][pUVar56[totc + 0x28]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x29]] = s->rfreq[iter][pUVar56[totc + 0x29]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x2a]] = s->rfreq[iter][pUVar56[totc + 0x2a]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x2b]] = s->rfreq[iter][pUVar56[totc + 0x2b]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x2c]] = s->rfreq[iter][pUVar56[totc + 0x2c]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x2d]] = s->rfreq[iter][pUVar56[totc + 0x2d]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x2e]] = s->rfreq[iter][pUVar56[totc + 0x2e]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x2f]] = s->rfreq[iter][pUVar56[totc + 0x2f]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x30]] = s->rfreq[iter][pUVar56[totc + 0x30]] + 1;
        s->rfreq[iter][pUVar56[totc + 0x31]] = s->rfreq[iter][pUVar56[totc + 0x31]] + 1;
      }
      else {
        for (gs = totc; gs <= bt; gs = gs + 1) {
          s->rfreq[iter][pUVar56[gs]] = s->rfreq[iter][pUVar56[gs]] + 1;
        }
      }
      totc = bt + 1;
    }
    if (2 < s->verbosity) {
      fprintf(_stderr,"      pass %d: size is %d, grp uses are ",(ulong)(alphaSize + 1),
              (long)bc / 8 & 0xffffffff);
      for (j = 0; j < (int)cost._8_4_; j = j + 1) {
        fprintf(_stderr,"%d ",(ulong)(uint)fave[(long)j + -2]);
      }
      fprintf(_stderr,"\n");
    }
    for (j = 0; j < (int)cost._8_4_; j = j + 1) {
      BZ2_hbMakeCodeLengths(s->len[j],s->rfreq[j],alphaSize_00,0x11);
    }
  }
  if (7 < (uint)cost._8_4_) {
    BZ2_bz__AssertH__fail(0xbba);
  }
  if ((0x7fff < minLen) || (0x4652 < minLen)) {
    BZ2_bz__AssertH__fail(0xbbb);
  }
  for (gs = 0; gs < (int)cost._8_4_; gs = gs + 1) {
    local_a6[gs] = (UChar)gs;
  }
  for (gs = 0; gs < minLen; gs = gs + 1) {
    UVar1 = s->selector[gs];
    ge = 0;
    local_a9 = local_a6[0];
    while (UVar1 != local_a9) {
      ge = ge + 1;
      UVar2 = local_a6[ge];
      local_a6[ge] = local_a9;
      local_a9 = UVar2;
    }
    local_a6[0] = local_a9;
    s->selectorMtf[gs] = (UChar)ge;
  }
  for (j = 0; j < (int)cost._8_4_; j = j + 1) {
    selCtr = 0x20;
    nGroups = 0;
    for (gs = 0; gs < alphaSize_00; gs = gs + 1) {
      if ((uint)nGroups < (uint)s->len[j][gs]) {
        nGroups = (Int32)s->len[j][gs];
      }
      if ((uint)s->len[j][gs] < (uint)selCtr) {
        selCtr = (Int32)s->len[j][gs];
      }
    }
    if (0x11 < (uint)nGroups) {
      BZ2_bz__AssertH__fail(0xbbc);
    }
    if (selCtr == 0) {
      BZ2_bz__AssertH__fail(0xbbd);
    }
    BZ2_hbAssignCodes(s->code[j],s->len[j],selCtr,nGroups,alphaSize_00);
  }
  for (gs = 0; gs < 0x10; gs = gs + 1) {
    acStack_c8[gs] = '\0';
    for (ge = 0; ge < 0x10; ge = ge + 1) {
      if (s->inUse[gs * 0x10 + ge] != '\0') {
        acStack_c8[gs] = '\x01';
      }
    }
  }
  iVar55 = s->numZ;
  for (gs = 0; gs < 0x10; gs = gs + 1) {
    if (acStack_c8[gs] == '\0') {
      bsW(s,1,0);
    }
    else {
      bsW(s,1,1);
    }
  }
  for (gs = 0; gs < 0x10; gs = gs + 1) {
    if (acStack_c8[gs] != '\0') {
      for (ge = 0; ge < 0x10; ge = ge + 1) {
        if (s->inUse[gs * 0x10 + ge] == '\0') {
          bsW(s,1,0);
        }
        else {
          bsW(s,1,1);
        }
      }
    }
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"      bytes: mapping %d, ",(ulong)(uint)(s->numZ - iVar55));
  }
  iVar55 = s->numZ;
  bsW(s,3,cost._8_4_);
  bsW(s,0xf,minLen);
  for (gs = 0; gs < minLen; gs = gs + 1) {
    for (ge = 0; ge < (int)(uint)s->selectorMtf[gs]; ge = ge + 1) {
      bsW(s,1,1);
    }
    bsW(s,1,0);
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"selectors %d, ",(ulong)(uint)(s->numZ - iVar55));
  }
  iVar55 = s->numZ;
  for (j = 0; j < (int)cost._8_4_; j = j + 1) {
    s_len_sel_selCtr._4_4_ = (uint)s->len[j][0];
    bsW(s,5,s_len_sel_selCtr._4_4_);
    for (gs = 0; gs < alphaSize_00; gs = gs + 1) {
      for (; (int)s_len_sel_selCtr._4_4_ < (int)(uint)s->len[j][gs];
          s_len_sel_selCtr._4_4_ = s_len_sel_selCtr._4_4_ + 1) {
        bsW(s,2,2);
      }
      for (; (int)(uint)s->len[j][gs] < (int)s_len_sel_selCtr._4_4_;
          s_len_sel_selCtr._4_4_ = s_len_sel_selCtr._4_4_ - 1) {
        bsW(s,2,3);
      }
      bsW(s,1,0);
    }
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"code lengths %d, ",(ulong)(uint)(s->numZ - iVar55));
  }
  iVar55 = s->numZ;
  nBytes = 0;
  totc = 0;
  while (totc < s->nMTF) {
    bt = totc + 0x31;
    if (s->nMTF <= bt) {
      bt = s->nMTF + -1;
    }
    if ((uint)cost._8_4_ <= (uint)s->selector[nBytes]) {
      BZ2_bz__AssertH__fail(0xbbe);
    }
    if ((cost._8_4_ == 6) && (bt - totc == 0x31)) {
      bVar3 = s->selector[nBytes];
      bVar4 = s->selector[nBytes];
      bsW(s,(uint)s->len[bVar3][pUVar56[totc]],s->code[bVar4][pUVar56[totc]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 1]],s->code[bVar4][pUVar56[totc + 1]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 2]],s->code[bVar4][pUVar56[totc + 2]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 3]],s->code[bVar4][pUVar56[totc + 3]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 4]],s->code[bVar4][pUVar56[totc + 4]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 5]],s->code[bVar4][pUVar56[totc + 5]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 6]],s->code[bVar4][pUVar56[totc + 6]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 7]],s->code[bVar4][pUVar56[totc + 7]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 8]],s->code[bVar4][pUVar56[totc + 8]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 9]],s->code[bVar4][pUVar56[totc + 9]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 10]],s->code[bVar4][pUVar56[totc + 10]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0xb]],s->code[bVar4][pUVar56[totc + 0xb]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0xc]],s->code[bVar4][pUVar56[totc + 0xc]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0xd]],s->code[bVar4][pUVar56[totc + 0xd]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0xe]],s->code[bVar4][pUVar56[totc + 0xe]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0xf]],s->code[bVar4][pUVar56[totc + 0xf]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x10]],s->code[bVar4][pUVar56[totc + 0x10]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x11]],s->code[bVar4][pUVar56[totc + 0x11]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x12]],s->code[bVar4][pUVar56[totc + 0x12]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x13]],s->code[bVar4][pUVar56[totc + 0x13]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x14]],s->code[bVar4][pUVar56[totc + 0x14]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x15]],s->code[bVar4][pUVar56[totc + 0x15]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x16]],s->code[bVar4][pUVar56[totc + 0x16]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x17]],s->code[bVar4][pUVar56[totc + 0x17]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x18]],s->code[bVar4][pUVar56[totc + 0x18]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x19]],s->code[bVar4][pUVar56[totc + 0x19]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x1a]],s->code[bVar4][pUVar56[totc + 0x1a]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x1b]],s->code[bVar4][pUVar56[totc + 0x1b]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x1c]],s->code[bVar4][pUVar56[totc + 0x1c]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x1d]],s->code[bVar4][pUVar56[totc + 0x1d]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x1e]],s->code[bVar4][pUVar56[totc + 0x1e]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x1f]],s->code[bVar4][pUVar56[totc + 0x1f]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x20]],s->code[bVar4][pUVar56[totc + 0x20]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x21]],s->code[bVar4][pUVar56[totc + 0x21]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x22]],s->code[bVar4][pUVar56[totc + 0x22]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x23]],s->code[bVar4][pUVar56[totc + 0x23]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x24]],s->code[bVar4][pUVar56[totc + 0x24]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x25]],s->code[bVar4][pUVar56[totc + 0x25]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x26]],s->code[bVar4][pUVar56[totc + 0x26]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x27]],s->code[bVar4][pUVar56[totc + 0x27]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x28]],s->code[bVar4][pUVar56[totc + 0x28]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x29]],s->code[bVar4][pUVar56[totc + 0x29]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x2a]],s->code[bVar4][pUVar56[totc + 0x2a]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x2b]],s->code[bVar4][pUVar56[totc + 0x2b]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x2c]],s->code[bVar4][pUVar56[totc + 0x2c]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x2d]],s->code[bVar4][pUVar56[totc + 0x2d]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x2e]],s->code[bVar4][pUVar56[totc + 0x2e]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x2f]],s->code[bVar4][pUVar56[totc + 0x2f]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x30]],s->code[bVar4][pUVar56[totc + 0x30]]);
      bsW(s,(uint)s->len[bVar3][pUVar56[totc + 0x31]],s->code[bVar4][pUVar56[totc + 0x31]]);
    }
    else {
      for (gs = totc; gs <= bt; gs = gs + 1) {
        bsW(s,(uint)s->len[s->selector[nBytes]][pUVar56[gs]],
            s->code[s->selector[nBytes]][pUVar56[gs]]);
      }
    }
    nBytes = nBytes + 1;
    totc = bt + 1;
  }
  if (nBytes != minLen) {
    BZ2_bz__AssertH__fail(0xbbf);
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"codes %d\n",(ulong)(uint)(s->numZ - iVar55));
  }
  return;
}

Assistant:

static
void sendMTFValues ( EState* s )
{
   Int32 v, t, i, j, gs, ge, totc, bt, bc, iter;
   Int32 nSelectors = 0, alphaSize, minLen, maxLen, selCtr;
   Int32 nGroups, nBytes;

   /*--
   UChar  len [BZ_N_GROUPS][BZ_MAX_ALPHA_SIZE];
   is a global since the decoder also needs it.

   Int32  code[BZ_N_GROUPS][BZ_MAX_ALPHA_SIZE];
   Int32  rfreq[BZ_N_GROUPS][BZ_MAX_ALPHA_SIZE];
   are also globals only used in this proc.
   Made global to keep stack frame size small.
   --*/


   UInt16 cost[BZ_N_GROUPS];
   Int32  fave[BZ_N_GROUPS];

   UInt16* mtfv = s->mtfv;

   if (s->verbosity >= 3)
      VPrintf3( "      %d in block, %d after MTF & 1-2 coding, "
                "%d+2 syms in use\n", 
                s->nblock, s->nMTF, s->nInUse );

   alphaSize = s->nInUse+2;
   for (t = 0; t < BZ_N_GROUPS; t++)
      for (v = 0; v < alphaSize; v++)
         s->len[t][v] = BZ_GREATER_ICOST;

   /*--- Decide how many coding tables to use ---*/
   AssertH ( s->nMTF > 0, 3001 );
   if (s->nMTF < 200)  nGroups = 2; else
   if (s->nMTF < 600)  nGroups = 3; else
   if (s->nMTF < 1200) nGroups = 4; else
   if (s->nMTF < 2400) nGroups = 5; else
                       nGroups = 6;

   /*--- Generate an initial set of coding tables ---*/
   { 
      Int32 nPart, remF, tFreq, aFreq;

      nPart = nGroups;
      remF  = s->nMTF;
      gs = 0;
      while (nPart > 0) {
         tFreq = remF / nPart;
         ge = gs-1;
         aFreq = 0;
         while (aFreq < tFreq && ge < alphaSize-1) {
            ge++;
            aFreq += s->mtfFreq[ge];
         }

         if (ge > gs 
             && nPart != nGroups && nPart != 1 
             && ((nGroups-nPart) % 2 == 1)) {
            aFreq -= s->mtfFreq[ge];
            ge--;
         }

         if (s->verbosity >= 3)
            VPrintf5( "      initial group %d, [%d .. %d], "
                      "has %d syms (%4.1f%%)\n",
                      nPart, gs, ge, aFreq, 
                      (100.0 * (float)aFreq) / (float)(s->nMTF) );
 
         for (v = 0; v < alphaSize; v++)
            if (v >= gs && v <= ge) 
               s->len[nPart-1][v] = BZ_LESSER_ICOST; else
               s->len[nPart-1][v] = BZ_GREATER_ICOST;
 
         nPart--;
         gs = ge+1;
         remF -= aFreq;
      }
   }

   /*--- 
      Iterate up to BZ_N_ITERS times to improve the tables.
   ---*/
   for (iter = 0; iter < BZ_N_ITERS; iter++) {

      for (t = 0; t < nGroups; t++) fave[t] = 0;

      for (t = 0; t < nGroups; t++)
         for (v = 0; v < alphaSize; v++)
            s->rfreq[t][v] = 0;

      /*---
        Set up an auxiliary length table which is used to fast-track
    the common case (nGroups == 6). 
      ---*/
      if (nGroups == 6) {
         for (v = 0; v < alphaSize; v++) {
            s->len_pack[v][0] = (s->len[1][v] << 16) | s->len[0][v];
            s->len_pack[v][1] = (s->len[3][v] << 16) | s->len[2][v];
            s->len_pack[v][2] = (s->len[5][v] << 16) | s->len[4][v];
     }
      }

      nSelectors = 0;
      totc = 0;
      gs = 0;
      while (True) {

         /*--- Set group start & end marks. --*/
         if (gs >= s->nMTF) break;
         ge = gs + BZ_G_SIZE - 1; 
         if (ge >= s->nMTF) ge = s->nMTF-1;

         /*-- 
            Calculate the cost of this group as coded
            by each of the coding tables.
         --*/
         for (t = 0; t < nGroups; t++) cost[t] = 0;

         if (nGroups == 6 && 50 == ge-gs+1) {
            /*--- fast track the common case ---*/
            register UInt32 cost01, cost23, cost45;
            register UInt16 icv;
            cost01 = cost23 = cost45 = 0;

#           define BZ_ITER(nn)                \
               icv = mtfv[gs+(nn)];           \
               cost01 += s->len_pack[icv][0]; \
               cost23 += s->len_pack[icv][1]; \
               cost45 += s->len_pack[icv][2]; \

            BZ_ITER(0);  BZ_ITER(1);  BZ_ITER(2);  BZ_ITER(3);  BZ_ITER(4);
            BZ_ITER(5);  BZ_ITER(6);  BZ_ITER(7);  BZ_ITER(8);  BZ_ITER(9);
            BZ_ITER(10); BZ_ITER(11); BZ_ITER(12); BZ_ITER(13); BZ_ITER(14);
            BZ_ITER(15); BZ_ITER(16); BZ_ITER(17); BZ_ITER(18); BZ_ITER(19);
            BZ_ITER(20); BZ_ITER(21); BZ_ITER(22); BZ_ITER(23); BZ_ITER(24);
            BZ_ITER(25); BZ_ITER(26); BZ_ITER(27); BZ_ITER(28); BZ_ITER(29);
            BZ_ITER(30); BZ_ITER(31); BZ_ITER(32); BZ_ITER(33); BZ_ITER(34);
            BZ_ITER(35); BZ_ITER(36); BZ_ITER(37); BZ_ITER(38); BZ_ITER(39);
            BZ_ITER(40); BZ_ITER(41); BZ_ITER(42); BZ_ITER(43); BZ_ITER(44);
            BZ_ITER(45); BZ_ITER(46); BZ_ITER(47); BZ_ITER(48); BZ_ITER(49);

#           undef BZ_ITER

            cost[0] = cost01 & 0xffff; cost[1] = cost01 >> 16;
            cost[2] = cost23 & 0xffff; cost[3] = cost23 >> 16;
            cost[4] = cost45 & 0xffff; cost[5] = cost45 >> 16;

         } else {
        /*--- slow version which correctly handles all situations ---*/
            for (i = gs; i <= ge; i++) { 
               UInt16 icv = mtfv[i];
               for (t = 0; t < nGroups; t++) cost[t] += s->len[t][icv];
            }
         }
 
         /*-- 
            Find the coding table which is best for this group,
            and record its identity in the selector table.
         --*/
         bc = 999999999; bt = -1;
         for (t = 0; t < nGroups; t++)
            if (cost[t] < bc) { bc = cost[t]; bt = t; };
         totc += bc;
         fave[bt]++;
         s->selector[nSelectors] = bt;
         nSelectors++;

         /*-- 
            Increment the symbol frequencies for the selected table.
          --*/
         if (nGroups == 6 && 50 == ge-gs+1) {
            /*--- fast track the common case ---*/

#           define BZ_ITUR(nn) s->rfreq[bt][ mtfv[gs+(nn)] ]++

            BZ_ITUR(0);  BZ_ITUR(1);  BZ_ITUR(2);  BZ_ITUR(3);  BZ_ITUR(4);
            BZ_ITUR(5);  BZ_ITUR(6);  BZ_ITUR(7);  BZ_ITUR(8);  BZ_ITUR(9);
            BZ_ITUR(10); BZ_ITUR(11); BZ_ITUR(12); BZ_ITUR(13); BZ_ITUR(14);
            BZ_ITUR(15); BZ_ITUR(16); BZ_ITUR(17); BZ_ITUR(18); BZ_ITUR(19);
            BZ_ITUR(20); BZ_ITUR(21); BZ_ITUR(22); BZ_ITUR(23); BZ_ITUR(24);
            BZ_ITUR(25); BZ_ITUR(26); BZ_ITUR(27); BZ_ITUR(28); BZ_ITUR(29);
            BZ_ITUR(30); BZ_ITUR(31); BZ_ITUR(32); BZ_ITUR(33); BZ_ITUR(34);
            BZ_ITUR(35); BZ_ITUR(36); BZ_ITUR(37); BZ_ITUR(38); BZ_ITUR(39);
            BZ_ITUR(40); BZ_ITUR(41); BZ_ITUR(42); BZ_ITUR(43); BZ_ITUR(44);
            BZ_ITUR(45); BZ_ITUR(46); BZ_ITUR(47); BZ_ITUR(48); BZ_ITUR(49);

#           undef BZ_ITUR

         } else {
        /*--- slow version which correctly handles all situations ---*/
            for (i = gs; i <= ge; i++)
               s->rfreq[bt][ mtfv[i] ]++;
         }

         gs = ge+1;
      }
      if (s->verbosity >= 3) {
         VPrintf2 ( "      pass %d: size is %d, grp uses are ", 
                   iter+1, totc/8 );
         for (t = 0; t < nGroups; t++)
            VPrintf1 ( "%d ", fave[t] );
         VPrintf0 ( "\n" );
      }

      /*--
        Recompute the tables based on the accumulated frequencies.
      --*/
      /* maxLen was changed from 20 to 17 in bzip2-1.0.3.  See 
         comment in huffman.c for details. */
      for (t = 0; t < nGroups; t++)
         BZ2_hbMakeCodeLengths ( &(s->len[t][0]), &(s->rfreq[t][0]), 
                                 alphaSize, 17 /*20*/ );
   }


   AssertH( nGroups < 8, 3002 );
   AssertH( nSelectors < 32768 &&
            nSelectors <= (2 + (900000 / BZ_G_SIZE)),
            3003 );


   /*--- Compute MTF values for the selectors. ---*/
   {
      UChar pos[BZ_N_GROUPS], ll_i, tmp2, tmp;
      for (i = 0; i < nGroups; i++) pos[i] = i;
      for (i = 0; i < nSelectors; i++) {
         ll_i = s->selector[i];
         j = 0;
         tmp = pos[j];
         while ( ll_i != tmp ) {
            j++;
            tmp2 = tmp;
            tmp = pos[j];
            pos[j] = tmp2;
         };
         pos[0] = tmp;
         s->selectorMtf[i] = j;
      }
   };

   /*--- Assign actual codes for the tables. --*/
   for (t = 0; t < nGroups; t++) {
      minLen = 32;
      maxLen = 0;
      for (i = 0; i < alphaSize; i++) {
         if (s->len[t][i] > maxLen) maxLen = s->len[t][i];
         if (s->len[t][i] < minLen) minLen = s->len[t][i];
      }
      AssertH ( !(maxLen > 17 /*20*/ ), 3004 );
      AssertH ( !(minLen < 1),  3005 );
      BZ2_hbAssignCodes ( &(s->code[t][0]), &(s->len[t][0]), 
                          minLen, maxLen, alphaSize );
   }

   /*--- Transmit the mapping table. ---*/
   { 
      Bool inUse16[16];
      for (i = 0; i < 16; i++) {
          inUse16[i] = False;
          for (j = 0; j < 16; j++)
             if (s->inUse[i * 16 + j]) inUse16[i] = True;
      }
     
      nBytes = s->numZ;
      for (i = 0; i < 16; i++)
         if (inUse16[i]) bsW(s,1,1); else bsW(s,1,0);

      for (i = 0; i < 16; i++)
         if (inUse16[i])
            for (j = 0; j < 16; j++) {
               if (s->inUse[i * 16 + j]) bsW(s,1,1); else bsW(s,1,0);
            }

      if (s->verbosity >= 3) 
         VPrintf1( "      bytes: mapping %d, ", s->numZ-nBytes );
   }

   /*--- Now the selectors. ---*/
   nBytes = s->numZ;
   bsW ( s, 3, nGroups );
   bsW ( s, 15, nSelectors );
   for (i = 0; i < nSelectors; i++) { 
      for (j = 0; j < s->selectorMtf[i]; j++) bsW(s,1,1);
      bsW(s,1,0);
   }
   if (s->verbosity >= 3)
      VPrintf1( "selectors %d, ", s->numZ-nBytes );

   /*--- Now the coding tables. ---*/
   nBytes = s->numZ;

   for (t = 0; t < nGroups; t++) {
      Int32 curr = s->len[t][0];
      bsW ( s, 5, curr );
      for (i = 0; i < alphaSize; i++) {
         while (curr < s->len[t][i]) { bsW(s,2,2); curr++; /* 10 */ };
         while (curr > s->len[t][i]) { bsW(s,2,3); curr--; /* 11 */ };
         bsW ( s, 1, 0 );
      }
   }

   if (s->verbosity >= 3)
      VPrintf1 ( "code lengths %d, ", s->numZ-nBytes );

   /*--- And finally, the block data proper ---*/
   nBytes = s->numZ;
   selCtr = 0;
   gs = 0;
   while (True) {
      if (gs >= s->nMTF) break;
      ge = gs + BZ_G_SIZE - 1; 
      if (ge >= s->nMTF) ge = s->nMTF-1;
      AssertH ( s->selector[selCtr] < nGroups, 3006 );

      if (nGroups == 6 && 50 == ge-gs+1) {
            /*--- fast track the common case ---*/
            UInt16 mtfv_i;
            UChar* s_len_sel_selCtr 
               = &(s->len[s->selector[selCtr]][0]);
            Int32* s_code_sel_selCtr
               = &(s->code[s->selector[selCtr]][0]);

#           define BZ_ITAH(nn)                      \
               mtfv_i = mtfv[gs+(nn)];              \
               bsW ( s,                             \
                     s_len_sel_selCtr[mtfv_i],      \
                     s_code_sel_selCtr[mtfv_i] )

            BZ_ITAH(0);  BZ_ITAH(1);  BZ_ITAH(2);  BZ_ITAH(3);  BZ_ITAH(4);
            BZ_ITAH(5);  BZ_ITAH(6);  BZ_ITAH(7);  BZ_ITAH(8);  BZ_ITAH(9);
            BZ_ITAH(10); BZ_ITAH(11); BZ_ITAH(12); BZ_ITAH(13); BZ_ITAH(14);
            BZ_ITAH(15); BZ_ITAH(16); BZ_ITAH(17); BZ_ITAH(18); BZ_ITAH(19);
            BZ_ITAH(20); BZ_ITAH(21); BZ_ITAH(22); BZ_ITAH(23); BZ_ITAH(24);
            BZ_ITAH(25); BZ_ITAH(26); BZ_ITAH(27); BZ_ITAH(28); BZ_ITAH(29);
            BZ_ITAH(30); BZ_ITAH(31); BZ_ITAH(32); BZ_ITAH(33); BZ_ITAH(34);
            BZ_ITAH(35); BZ_ITAH(36); BZ_ITAH(37); BZ_ITAH(38); BZ_ITAH(39);
            BZ_ITAH(40); BZ_ITAH(41); BZ_ITAH(42); BZ_ITAH(43); BZ_ITAH(44);
            BZ_ITAH(45); BZ_ITAH(46); BZ_ITAH(47); BZ_ITAH(48); BZ_ITAH(49);

#           undef BZ_ITAH

      } else {
     /*--- slow version which correctly handles all situations ---*/
         for (i = gs; i <= ge; i++) {
            bsW ( s, 
                  s->len  [s->selector[selCtr]] [mtfv[i]],
                  s->code [s->selector[selCtr]] [mtfv[i]] );
         }
      }


      gs = ge+1;
      selCtr++;
   }
   AssertH( selCtr == nSelectors, 3007 );

   if (s->verbosity >= 3)
      VPrintf1( "codes %d\n", s->numZ-nBytes );
}